

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O2

void __thiscall antlr::BitSet::BitSet(BitSet *this,uint nbits)

{
  uint i;
  size_type __n;
  reference rVar1;
  allocator_type local_19;
  
  std::vector<bool,_std::allocator<bool>_>::vector(&this->storage,(ulong)nbits,&local_19);
  for (__n = 0; nbits != __n; __n = __n + 1) {
    rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->storage,__n);
    *rVar1._M_p = *rVar1._M_p & ~rVar1._M_mask;
  }
  return;
}

Assistant:

BitSet::BitSet(unsigned int nbits)
: storage(nbits)
{
	for (unsigned int i = 0; i < nbits ; i++ )
		storage[i] = false;
}